

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_strtoupper(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  char *zString_00;
  ushort **ppuVar1;
  bool bVar2;
  int local_48;
  int local_44;
  int c;
  int nLen;
  char *zEnd;
  char *zCur;
  char *zString;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  zString = (char *)apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if (nArg < 1) {
    jx9_result_null(pCtx);
  }
  else {
    zCur = jx9_value_to_string(*apArg,&local_44);
    if (local_44 < 1) {
      jx9_result_string(pjStack_18,"",0);
    }
    else {
      _c = zCur + local_44;
      while (zString_00 = zCur, zCur < _c) {
        if ((byte)*zCur < 0xc0) {
          local_48 = (int)*zCur;
          ppuVar1 = __ctype_b_loc();
          if (((*ppuVar1)[local_48] & 0x200) != 0) {
            local_48 = toupper((int)*zCur);
          }
          jx9_result_string(pjStack_18,(char *)&local_48,1);
          zCur = zCur + 1;
        }
        else {
          zEnd = zCur;
          do {
            zCur = zCur + 1;
            bVar2 = false;
            if (zCur < _c) {
              bVar2 = (*zCur & 0xc0U) == 0x80;
            }
          } while (bVar2);
          jx9_result_string(pjStack_18,zString_00,(int)zCur - (int)zString_00);
        }
      }
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_strtoupper(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zString, *zCur, *zEnd;
	int nLen;
	if( nArg < 1 ){
		/* Missing arguments, return null */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Extract the target string */
	zString = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Empty string, return */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Perform the requested operation */
	zEnd = &zString[nLen];
	for(;;){
		if( zString >= zEnd ){
			/* No more input, break immediately */
			break;
		}
		if( (unsigned char)zString[0] >= 0xc0 ){
			/* UTF-8 stream, output verbatim */
			zCur = zString;
			zString++;
			while( zString < zEnd && ((unsigned char)zString[0] & 0xc0) == 0x80){
				zString++;
			}
			/* Append UTF-8 stream */
			jx9_result_string(pCtx, zCur, (int)(zString-zCur));
		}else{
			int c = zString[0];
			if( SyisLower(c) ){
				c = SyToUpper(zString[0]);
			}
			/* Append character */
			jx9_result_string(pCtx, (const char *)&c, (int)sizeof(char));
			/* Advance the cursor */
			zString++;
		}
	}
	return JX9_OK;
}